

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  long *plVar1;
  bool bVar2;
  Verbosity VVar3;
  long in_RDI;
  Verbosity old_verbosity;
  SPxId enterId;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000003a0;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000003a8;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  bool bVar4;
  SPxColId *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  undefined1 uVar5;
  bool local_159;
  bool local_141;
  SPxRowId local_140;
  SPxColId local_138;
  undefined8 local_130;
  undefined1 local_128 [80];
  DataKey local_d8;
  undefined4 local_d0;
  Verbosity local_cc;
  SPxRowId local_c8;
  SPxColId local_c0;
  undefined1 local_b8 [80];
  DataKey local_68;
  DataKey local_58;
  long local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  undefined8 *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  SPxId::SPxId((SPxId *)0x5c81f9);
  local_50 = in_RDI + 0x18;
  local_48 = local_b8;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),in_stack_fffffffffffffe78
            );
  local_68 = (DataKey)selectEnterX(in_stack_000003a8,in_stack_000003a0);
  local_58 = local_68;
  bVar2 = SPxId::isSPxColId((SPxId *)&local_58);
  local_141 = false;
  if (bVar2) {
    SPxColId::SPxColId(&local_c0,(SPxId *)&local_58);
    local_141 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                          in_stack_fffffffffffffe88);
  }
  if (local_141 != false) {
    local_58 = (DataKey)((ulong)local_58 & 0xffffffff00000000);
  }
  bVar2 = SPxId::isSPxRowId((SPxId *)&local_58);
  local_159 = false;
  if (bVar2) {
    SPxRowId::SPxRowId(&local_c8,(SPxId *)&local_58);
    local_159 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                          (SPxRowId *)in_stack_fffffffffffffe88);
  }
  if (local_159 != false) {
    local_58 = (DataKey)((ulong)local_58 & 0xffffffff00000000);
  }
  bVar2 = SPxId::isValid((SPxId *)&local_58);
  if ((!bVar2) && ((*(byte *)(in_RDI + 0x140) & 1) == 0)) {
    *(undefined1 *)(in_RDI + 0x140) = 1;
    if ((*(long *)(*(long *)(in_RDI + 0x10) + 0x1000) != 0) &&
       (VVar3 = SPxOut::getVerbosity(*(SPxOut **)(*(long *)(in_RDI + 0x10) + 0x1000)),
       4 < (int)VVar3)) {
      local_cc = SPxOut::getVerbosity(*(SPxOut **)(*(long *)(in_RDI + 0x10) + 0x1000));
      plVar1 = *(long **)(*(long *)(in_RDI + 0x10) + 0x1000);
      local_d0 = 5;
      (**(code **)(*plVar1 + 0x10))(plVar1,&local_d0);
      soplex::operator<<((SPxOut *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                         (char *)in_stack_fffffffffffffe78);
      plVar1 = *(long **)(*(long *)(in_RDI + 0x10) + 0x1000);
      (**(code **)(*plVar1 + 0x10))(plVar1,&local_cc);
    }
    local_30 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(in_RDI + 0x18);
    local_130 = 0x4000000000000000;
    local_28 = local_128;
    local_38 = &local_130;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_39,local_30);
    local_20 = local_128;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
    local_10 = local_128;
    local_18 = local_30;
    local_8 = local_38;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78,(double *)0x5c84cb);
    local_d8 = (DataKey)selectEnterX(in_stack_000003a8,in_stack_000003a0);
    local_58 = local_d8;
    bVar2 = SPxId::isSPxColId((SPxId *)&local_58);
    uVar5 = false;
    if (bVar2) {
      in_stack_fffffffffffffe88 = *(SPxColId **)(in_RDI + 0x10);
      SPxColId::SPxColId(&local_138,(SPxId *)&local_58);
      uVar5 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT17(uVar5,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88);
    }
    if ((bool)uVar5 != false) {
      local_58 = (DataKey)((ulong)local_58 & 0xffffffff00000000);
    }
    bVar2 = SPxId::isSPxRowId((SPxId *)&local_58);
    bVar4 = false;
    if (bVar2) {
      SPxRowId::SPxRowId(&local_140,(SPxId *)&local_58);
      bVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT17(uVar5,in_stack_fffffffffffffe90),
                        (SPxRowId *)in_stack_fffffffffffffe88);
    }
    if (bVar4 != false) {
      local_58 = (DataKey)((ulong)local_58 & 0xffffffff00000000);
    }
  }
  return (SPxId)local_58;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnter()
{
   assert(this->thesolver != nullptr);

   SPxId enterId;

   enterId = selectEnterX(this->thetolerance);

   if(enterId.isSPxColId() && this->thesolver->isBasic(SPxColId(enterId)))
      enterId.info = 0;

   if(enterId.isSPxRowId() && this->thesolver->isBasic(SPxRowId(enterId)))
      enterId.info = 0;

   if(!enterId.isValid() && !refined)
   {
      refined = true;
      SPX_MSG_INFO3((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << "WDEVEX02 trying refinement step..\n";)
      enterId = selectEnterX(this->thetolerance / SOPLEX_DEVEX_REFINETOL);

      if(enterId.isSPxColId() && this->thesolver->isBasic(SPxColId(enterId)))
         enterId.info = 0;

      if(enterId.isSPxRowId() && this->thesolver->isBasic(SPxRowId(enterId)))
         enterId.info = 0;
   }

   return enterId;
}